

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

Colorf __thiscall Colorf::to_sRGB(Colorf *this)

{
  float fVar1;
  undefined1 auVar2 [16];
  Colorf CVar3;
  float *pfVar4;
  undefined1 auVar5 [64];
  int local_2c;
  int i;
  float b;
  float a;
  Colorf *this_local;
  undefined4 uStack_10;
  Colorf srgb;
  undefined1 extraout_var [56];
  
  Colorf((Colorf *)((long)&this_local + 4),0.0);
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    pfVar4 = operator[](this,local_2c);
    if (0.0031308 < *pfVar4) {
      pfVar4 = operator[](this,local_2c);
      auVar5._0_8_ = std::pow((double)(ulong)(uint)*pfVar4,SUB648(ZEXT464(0x3ed55555),0));
      auVar5._8_56_ = extraout_var;
      auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f870a3d),0),auVar5._0_16_,
                               SUB6416(ZEXT464(0xbd6147ae),0));
      pfVar4 = operator[]((Colorf *)((long)&this_local + 4),local_2c);
      *pfVar4 = auVar2._0_4_;
    }
    else {
      pfVar4 = operator[](this,local_2c);
      fVar1 = *pfVar4;
      pfVar4 = operator[]((Colorf *)((long)&this_local + 4),local_2c);
      *pfVar4 = fVar1 * 12.92;
    }
  }
  CVar3.b = srgb.r;
  CVar3.r = (float)this_local._4_4_;
  CVar3.g = (float)uStack_10;
  return CVar3;
}

Assistant:

Colorf Colorf::to_sRGB() const {
	const float a = 0.055f;
	const float b = 1.f / 2.4f;
	Colorf srgb;
	for (int i = 0; i < 3; ++i){
		if ((*this)[i] <= 0.0031308f){
			srgb[i] = 12.92f * (*this)[i];
		}
		else {
			srgb[i] = (1.f + a) * std::pow((*this)[i], b) - a;
		}
	}
	return srgb;
}